

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall
cppcms::json::bad_value_cast::bad_value_cast
          (bad_value_cast *this,string *s,json_type expected,json_type actual)

{
  ostream *poVar1;
  ostringstream msg;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  booster::bad_cast::bad_cast(&this->super_bad_cast);
  *(undefined ***)&this->super_bad_cast = &PTR__bad_value_cast_00113bb8;
  (this->super_bad_cast).super_backtrace._vptr_backtrace =
       (_func_int **)&PTR__bad_value_cast_00113be0;
  std::operator+(&this->msg_,"cppcms::json::bad_cast: ",s);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0," error converting from ");
  operator<<(poVar1,actual);
  poVar1 = std::operator<<(poVar1," to ");
  operator<<(poVar1,expected);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)&this->msg_);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

bad_value_cast::bad_value_cast(std::string const &s,json_type expected, json_type actual) : 
		msg_("cppcms::json::bad_cast: " + s)
	{
		std::ostringstream msg;
		msg<<" error converting from "<<actual<<" to "<<expected;
		msg_ +=msg.str();

	}